

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConfigData::ConfigData(ConfigData *this,ConfigData *param_1)

{
  YesOrNo YVar1;
  Level LVar2;
  What WVar3;
  OrNot OVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined2 uVar15;
  int iVar16;
  ConfigData *param_1_local;
  ConfigData *this_local;
  
  YVar1 = param_1->useColour;
  this->runOrder = param_1->runOrder;
  this->useColour = YVar1;
  bVar5 = param_1->listTests;
  bVar6 = param_1->listTags;
  bVar7 = param_1->listReporters;
  bVar8 = param_1->listTestNamesOnly;
  bVar9 = param_1->showSuccessfulTests;
  bVar10 = param_1->shouldDebugBreak;
  bVar11 = param_1->noThrow;
  bVar12 = param_1->showHelp;
  bVar13 = param_1->showInvisibles;
  bVar14 = param_1->filenamesAsTags;
  uVar15 = *(undefined2 *)&param_1->field_0xa;
  iVar16 = param_1->abortAfter;
  LVar2 = param_1->verbosity;
  WVar3 = param_1->warnings;
  OVar4 = param_1->showDurations;
  this->rngSeed = param_1->rngSeed;
  this->verbosity = LVar2;
  this->warnings = WVar3;
  this->showDurations = OVar4;
  this->listTests = bVar5;
  this->listTags = bVar6;
  this->listReporters = bVar7;
  this->listTestNamesOnly = bVar8;
  this->showSuccessfulTests = bVar9;
  this->shouldDebugBreak = bVar10;
  this->noThrow = bVar11;
  this->showHelp = bVar12;
  this->showInvisibles = bVar13;
  this->filenamesAsTags = bVar14;
  *(undefined2 *)&this->field_0xa = uVar15;
  this->abortAfter = iVar16;
  std::__cxx11::string::string((string *)&this->outputFilename,(string *)&param_1->outputFilename);
  std::__cxx11::string::string((string *)&this->name,(string *)&param_1->name);
  std::__cxx11::string::string((string *)&this->processName,(string *)&param_1->processName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->reporterNames,&param_1->reporterNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->testsOrTags,&param_1->testsOrTags);
  return;
}

Assistant:

ConfigData()
        :   listTests( false ),
            listTags( false ),
            listReporters( false ),
            listTestNamesOnly( false ),
            showSuccessfulTests( false ),
            shouldDebugBreak( false ),
            noThrow( false ),
            showHelp( false ),
            showInvisibles( false ),
            filenamesAsTags( false ),
            abortAfter( -1 ),
            rngSeed( 0 ),
            verbosity( Verbosity::Normal ),
            warnings( WarnAbout::Nothing ),
            showDurations( ShowDurations::DefaultForReporter ),
            runOrder( RunTests::InDeclarationOrder ),
            useColour( UseColour::Auto )
        {}